

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O3

TV __thiscall Nova::Grid<float,_3>::Center(Grid<float,_3> *this,T_INDEX *index)

{
  Vector<float,_3,_true> *data_copy_1;
  int i;
  long lVar1;
  undefined8 *in_RDI;
  TV TVar2;
  Vector<float,_3,_true> data_copy;
  
  lVar1 = 0;
  do {
    data_copy._data._M_elems[lVar1] = (float)(index->_data)._M_elems[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    TVar2._data._M_elems[2] = *(float *)((long)data_copy._data._M_elems + lVar1) + -0.5;
    *(float *)((long)data_copy._data._M_elems + lVar1) = TVar2._data._M_elems[2];
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  lVar1 = 0;
  do {
    *(float *)((long)data_copy._data._M_elems + lVar1) =
         *(float *)((long)data_copy._data._M_elems + lVar1) *
         *(float *)((long)(this->dX)._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  *(float *)(in_RDI + 1) = (this->domain).min_corner._data._M_elems[2];
  *in_RDI = *(undefined8 *)(this->domain).min_corner._data._M_elems;
  lVar1 = 0;
  do {
    TVar2._data._M_elems[0] =
         *(float *)((long)in_RDI + lVar1) + *(float *)((long)data_copy._data._M_elems + lVar1);
    TVar2._data._M_elems[1] = 0.0;
    *(float *)((long)in_RDI + lVar1) = TVar2._data._M_elems[0];
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  return (TV)TVar2._data._M_elems;
}

Assistant:

TV Center(const T_INDEX& index) const
    {
        return domain.min_corner+(TV(index)-(T).5)*dX;
    }